

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::DataParameter::ByteSizeLong(DataParameter *this)

{
  bool bVar1;
  DataParameter_DB value;
  uint32 uVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  string *psVar4;
  size_t sVar5;
  size_t sStack_48;
  int cached_size;
  size_t total_size;
  DataParameter *this_local;
  
  sStack_48 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = DataParameter::unknown_fields(this);
    sStack_48 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 0xff) != 0) {
    bVar1 = has_source(this);
    if (bVar1) {
      psVar4 = source_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_mean_file(this);
    if (bVar1) {
      psVar4 = mean_file_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_batch_size(this);
    if (bVar1) {
      uVar2 = batch_size(this);
      sVar5 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_crop_size(this);
    if (bVar1) {
      uVar2 = crop_size(this);
      sVar5 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_rand_skip(this);
    if (bVar1) {
      uVar2 = rand_skip(this);
      sVar5 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_mirror(this);
    if (bVar1) {
      sStack_48 = sStack_48 + 2;
    }
    bVar1 = has_force_encoded_color(this);
    if (bVar1) {
      sStack_48 = sStack_48 + 2;
    }
    bVar1 = has_backend(this);
    if (bVar1) {
      value = backend(this);
      sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(value);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 0x300) != 0) {
    bVar1 = has_scale(this);
    if (bVar1) {
      sStack_48 = sStack_48 + 5;
    }
    bVar1 = has_prefetch(this);
    if (bVar1) {
      uVar2 = prefetch(this);
      sVar5 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_48);
  this->_cached_size_ = iVar3;
  return sStack_48;
}

Assistant:

size_t DataParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.DataParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 255u) {
    // optional string source = 1;
    if (has_source()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->source());
    }

    // optional string mean_file = 3;
    if (has_mean_file()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->mean_file());
    }

    // optional uint32 batch_size = 4;
    if (has_batch_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->batch_size());
    }

    // optional uint32 crop_size = 5 [default = 0];
    if (has_crop_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->crop_size());
    }

    // optional uint32 rand_skip = 7 [default = 0];
    if (has_rand_skip()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->rand_skip());
    }

    // optional bool mirror = 6 [default = false];
    if (has_mirror()) {
      total_size += 1 + 1;
    }

    // optional bool force_encoded_color = 9 [default = false];
    if (has_force_encoded_color()) {
      total_size += 1 + 1;
    }

    // optional .caffe.DataParameter.DB backend = 8 [default = LEVELDB];
    if (has_backend()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->backend());
    }

  }
  if (_has_bits_[8 / 32] & 768u) {
    // optional float scale = 2 [default = 1];
    if (has_scale()) {
      total_size += 1 + 4;
    }

    // optional uint32 prefetch = 10 [default = 4];
    if (has_prefetch()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->prefetch());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}